

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

Uint32 GPU_LoadShader(GPU_ShaderEnum shader_type,char *filename)

{
  SDL_RWops *shader_source;
  SDL_RWops *rwops;
  char *filename_local;
  GPU_ShaderEnum shader_type_local;
  
  if (filename == (char *)0x0) {
    GPU_PushErrorCode("GPU_LoadShader",GPU_ERROR_NULL_ARGUMENT,"filename");
    filename_local._4_4_ = 0;
  }
  else {
    shader_source = (SDL_RWops *)SDL_RWFromFile(filename,"r");
    if (shader_source == (SDL_RWops *)0x0) {
      GPU_PushErrorCode("GPU_LoadShader",GPU_ERROR_FILE_NOT_FOUND,"%s",filename);
      filename_local._4_4_ = 0;
    }
    else {
      filename_local._4_4_ = GPU_CompileShader_RW(shader_type,shader_source,true);
    }
  }
  return filename_local._4_4_;
}

Assistant:

Uint32 GPU_LoadShader(GPU_ShaderEnum shader_type, const char* filename)
{
    SDL_RWops* rwops;

    if(filename == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_NULL_ARGUMENT, "filename");
        return 0;
    }
    
    rwops = SDL_RWFromFile(filename, "r");
    if(rwops == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_FILE_NOT_FOUND, "%s", filename);
        return 0;
    }
    
    return GPU_CompileShader_RW(shader_type, rwops, 1);
}